

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  size_t u;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  FSE_CTable FVar11;
  uint uVar12;
  ulong uVar13;
  U32 u_1;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  
  uVar21 = 1 << ((byte)tableLog & 0x1f);
  uVar13 = 1;
  if (tableLog != 0) {
    uVar13 = (ulong)(uVar21 >> 1);
  }
  if (((ulong)workSpace & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x56,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar8 = (ulong)(maxSymbolValue + 2);
  sVar6 = 0xffffffffffffffd4;
  if (((1L << ((byte)tableLog & 0x3f)) + uVar8 & 0xfffffffffffffffe) * 2 + 8 <= wkspSize) {
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    if (0xf < tableLog) {
      __assert_fail("tableLog < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                    ,0x5b,
                    "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                   );
    }
    uVar12 = uVar21 - 1;
    *(undefined2 *)workSpace = 0;
    uVar15 = maxSymbolValue + 1;
    uVar9 = uVar12;
    if (uVar15 != 0) {
      uVar14 = 0;
      uVar7 = (ulong)uVar12;
      do {
        iVar19 = (int)uVar14;
        uVar2 = normalizedCounter[uVar14];
        if (uVar2 == 0xffff) {
          *(short *)((long)workSpace + (ulong)(iVar19 + 1U) * 2) =
               *(short *)((long)workSpace + uVar14 * 2) + 1;
          uVar18 = (ulong)((int)uVar7 - 1);
          *(char *)((long)workSpace + uVar7 + uVar8 * 2) = (char)uVar14;
        }
        else {
          if ((short)uVar2 < 0) {
            __assert_fail("normalizedCounter[u-1] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                          ,0x6c,
                          "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                         );
          }
          puVar1 = (ushort *)((long)workSpace + uVar14 * 2);
          uVar3 = *puVar1;
          *(ushort *)((long)workSpace + (ulong)(iVar19 + 1U) * 2) = uVar2 + *puVar1;
          uVar18 = uVar7;
          if (CARRY2(uVar2,uVar3)) {
            __assert_fail("cumul[u] >= cumul[u-1]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                          ,0x6e,
                          "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                         );
          }
        }
        uVar9 = (uint)uVar18;
        uVar14 = (ulong)(iVar19 + 1);
        uVar7 = uVar18;
      } while (iVar19 + 2U <= uVar15);
    }
    iVar19 = (uVar21 >> 1) + (uVar21 >> 3) + 3;
    *(short *)((long)workSpace + (ulong)uVar15 * 2) = (short)uVar21 + 1;
    uVar7 = (ulong)uVar21;
    if (uVar9 == uVar12) {
      lVar22 = (long)workSpace + uVar7 + uVar8 * 2;
      if (uVar15 != 0) {
        lVar16 = 0;
        lVar10 = 0;
        uVar14 = 0;
        do {
          uVar9 = (uint)uVar14;
          sVar4 = normalizedCounter[uVar14];
          uVar14 = (ulong)sVar4;
          *(long *)(lVar22 + lVar16) = lVar10;
          if (8 < (long)uVar14) {
            uVar18 = 8;
            do {
              *(long *)(lVar22 + lVar16 + uVar18) = lVar10;
              uVar18 = uVar18 + 8;
            } while (uVar18 < uVar14);
          }
          if (sVar4 < 0) {
            __assert_fail("n>=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                          ,0x84,
                          "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                         );
          }
          lVar16 = lVar16 + uVar14;
          lVar10 = lVar10 + 0x101010101010101;
          uVar14 = (ulong)(uVar9 + 1);
        } while (uVar9 != maxSymbolValue);
      }
      if ((uVar21 & 1) != 0) {
        __assert_fail("tableSize % unroll == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0x8f,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      uVar14 = 0;
      uVar9 = 0;
      do {
        lVar10 = 0;
        uVar15 = uVar9;
        do {
          *(undefined1 *)((long)workSpace + (ulong)(uVar15 & uVar12) + uVar8 * 2) =
               *(undefined1 *)(lVar22 + lVar10);
          lVar10 = lVar10 + 1;
          uVar15 = uVar15 + iVar19;
        } while (lVar10 == 1);
        uVar9 = uVar9 + iVar19 * 2 & uVar12;
        uVar14 = uVar14 + 2;
        lVar22 = lVar22 + 2;
      } while (uVar14 < uVar7);
      if (uVar9 != 0) {
        __assert_fail("position == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0x98,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    else if (uVar15 != 0) {
      uVar14 = 0;
      uVar18 = 0;
      do {
        sVar4 = normalizedCounter[uVar14];
        if (0 < sVar4) {
          iVar20 = 0;
          do {
            *(char *)((long)workSpace + uVar18 + uVar8 * 2) = (char)uVar14;
            do {
              uVar17 = (int)uVar18 + iVar19 & uVar12;
              uVar18 = (ulong)uVar17;
            } while (uVar9 < uVar17);
            iVar20 = iVar20 + 1;
          } while (iVar20 != sVar4);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar15);
      if ((int)uVar18 != 0) {
        __assert_fail("position==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0xa6,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    uVar14 = 0;
    do {
      uVar18 = (ulong)*(byte *)((long)workSpace + uVar14 + uVar8 * 2);
      uVar2 = *(ushort *)((long)workSpace + uVar18 * 2);
      *(ushort *)((long)workSpace + uVar18 * 2) = uVar2 + 1;
      *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = (short)uVar21 + (short)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar7 != uVar14);
    FVar11 = tableLog * 0x10000 - uVar21;
    sVar6 = 0;
    uVar21 = 0;
    iVar19 = 0;
    do {
      uVar8 = (ulong)uVar21;
      sVar4 = normalizedCounter[uVar8];
      if ((sVar4 == -1) || (sVar4 == 1)) {
        ct[uVar13 + uVar8 * 2 + 2] = FVar11;
        if (iVar19 < 0) {
          __assert_fail("total <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xbd,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        ct[uVar13 + uVar8 * 2 + 1] = iVar19 - 1;
        iVar19 = iVar19 + 1;
      }
      else if (sVar4 == 0) {
        ct[uVar13 + uVar8 * 2 + 2] = FVar11 + 0x10000;
      }
      else {
        if (sVar4 < 2) {
          __assert_fail("normalizedCounter[s] > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xc2,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        iVar20 = (int)sVar4;
        uVar9 = iVar20 - 1;
        if ((short)uVar9 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                        ,0xab,"unsigned int ZSTD_highbit32(U32)");
        }
        iVar5 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        ct[uVar13 + uVar8 * 2 + 2] =
             (tableLog - iVar5) * 0x10000 - (iVar20 << ((byte)(tableLog - iVar5) & 0x1f));
        ct[uVar13 + uVar8 * 2 + 1] = iVar19 - iVar20;
        iVar19 = iVar19 + iVar20;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 <= maxSymbolValue);
  }
  return sVar6;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}